

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tictactoe.cpp
# Opt level: O2

bool __thiscall Game::IsLineOwned(Game *this,Line line)

{
  ulong *puVar1;
  Player PVar2;
  long lVar3;
  bool bVar4;
  
  lVar3 = 0;
  do {
    if (lVar3 == 0x18) {
      PVar2 = (this->m_board)._M_elems[line._M_elems[1]];
      if ((PVar2 == None) || (PVar2 != (this->m_board)._M_elems[line._M_elems[0]])) {
        bVar4 = false;
      }
      else {
        bVar4 = PVar2 == (this->m_board)._M_elems[line._M_elems[2]];
      }
      return bVar4;
    }
    puVar1 = (ulong *)((long)line._M_elems + lVar3);
    lVar3 = lVar3 + 8;
  } while (*puVar1 < 9);
  __assert_fail("index < 9",
                "/workspace/llm4binary/github/license_all_cmakelists_25/AntoineJT[P]cpp-things/tictactoe.cpp"
                ,0x3f,"bool Game::IsLineOwned(Line) const");
}

Assistant:

bool IsLineOwned(Line line) const noexcept {
            #ifndef NDEBUG
            for (auto index : line) {
                assert(index < 9);
            }
            #endif

            const auto middleCellOwner = m_board[line[1]];
            if (middleCellOwner == Player::None) {
                return false;
            }

            return middleCellOwner == m_board[line[0]]
                && middleCellOwner == m_board[line[2]];
        }